

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_4::Validator::OnTableSizeExpr(Validator *this,TableSizeExpr *expr)

{
  Result RVar1;
  Var VStack_68;
  
  Var::Var(&VStack_68,&expr->var);
  RVar1 = SharedValidator::OnTableSize
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)50>).super_Expr.loc,
                     &VStack_68);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&VStack_68);
  return (Result)Ok;
}

Assistant:

Result Validator::OnTableSizeExpr(TableSizeExpr* expr) {
  result_ |= validator_.OnTableSize(expr->loc, expr->var);
  return Result::Ok;
}